

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O0

String * __thiscall luna::GC::NewString(GC *this,GCGeneration gen)

{
  String *this_00;
  undefined4 in_ESI;
  String *s;
  GCGeneration in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff0;
  
  this_00 = (String *)operator_new(0x38);
  String::String(this_00);
  (this_00->super_GCObject).field_0x10 = (this_00->super_GCObject).field_0x10 & 0xf | 0x50;
  SetObjectGen((GC *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),&this_00->super_GCObject,
               in_stack_ffffffffffffffe4);
  return this_00;
}

Assistant:

String * GC::NewString(GCGeneration gen)
    {
        auto s = new String;
        s->gc_obj_type_ = GCObjectType_String;
        SetObjectGen(s, gen);
        return s;
    }